

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_add_entry_len_l
                  (archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id,char *name,
                  size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_acl_entry *paVar2;
  int *piVar3;
  wchar_t local_3c;
  wchar_t r;
  archive_acl_entry *ap;
  char *name_local;
  wchar_t id_local;
  wchar_t tag_local;
  wchar_t permset_local;
  wchar_t type_local;
  archive_acl *acl_local;
  
  wVar1 = acl_special(acl,type,permset,tag);
  if (wVar1 == L'\0') {
    acl_local._4_4_ = L'\0';
  }
  else {
    paVar2 = acl_new_entry(acl,type,permset,tag,id);
    if (paVar2 == (archive_acl_entry *)0x0) {
      acl_local._4_4_ = L'\xffffffe7';
    }
    else {
      if (((name == (char *)0x0) || (*name == '\0')) || (len == 0)) {
        local_3c = L'\0';
        archive_mstring_clean(&paVar2->name);
      }
      else {
        local_3c = archive_mstring_copy_mbs_len_l(&paVar2->name,name,len,sc);
      }
      if (local_3c == L'\0') {
        acl_local._4_4_ = L'\0';
      }
      else {
        piVar3 = __errno_location();
        if (*piVar3 == 0xc) {
          acl_local._4_4_ = L'\xffffffe2';
        }
        else {
          acl_local._4_4_ = L'\xffffffec';
        }
      }
    }
  }
  return acl_local._4_4_;
}

Assistant:

static int
archive_acl_add_entry_len_l(struct archive_acl *acl,
    int type, int permset, int tag, int id, const char *name, size_t len,
    struct archive_string_conv *sc)
{
	struct archive_acl_entry *ap;
	int r;

	if (acl_special(acl, type, permset, tag) == 0)
		return ARCHIVE_OK;
	ap = acl_new_entry(acl, type, permset, tag, id);
	if (ap == NULL) {
		/* XXX Error XXX */
		return ARCHIVE_FAILED;
	}
	if (name != NULL  &&  *name != '\0' && len > 0) {
		r = archive_mstring_copy_mbs_len_l(&ap->name, name, len, sc);
	} else {
		r = 0;
		archive_mstring_clean(&ap->name);
	}
	if (r == 0)
		return (ARCHIVE_OK);
	else if (errno == ENOMEM)
		return (ARCHIVE_FATAL);
	else
		return (ARCHIVE_WARN);
}